

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::getBestAppending
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          int32_t missingFields,int32_t flags,UErrorCode *status,
          UDateTimePatternMatchOptions options)

{
  bool bVar1;
  int iVar2;
  UnicodeString *pUVar3;
  DistanceInfo *missingFields_00;
  uint uVar4;
  UDateTimePatternField field;
  uint uVar5;
  long lVar6;
  PtnSkeleton *specifiedSkeleton;
  UnicodeString resultPattern;
  UnicodeString *values [3];
  UnicodeString tempPattern;
  UnicodeString appendName;
  PtnSkeleton *local_180;
  UObject local_178;
  uint local_170;
  UErrorCode local_16c;
  UErrorCode *local_168;
  undefined1 *local_160;
  UnicodeString local_158;
  UnicodeString *local_118;
  UnicodeString *local_110;
  UnicodeString *local_108;
  UnicodeString local_f8;
  UnicodeString local_b8;
  UnicodeString local_78;
  
  if (U_ZERO_ERROR < *status) {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_0048be70;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    return __return_storage_ptr__;
  }
  local_158.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_158.fUnion.fStackFields.fLengthAndFlags = 2;
  local_f8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
  local_f8.fUnion.fStackFields.fLengthAndFlags = 2;
  if (missingFields != 0) {
    local_178._vptr_UObject = (_func_int **)&PTR__UnicodeString_0048be70;
    local_78.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0048be70;
    local_78.fUnion.fStackFields.fLengthAndFlags = 2;
    icu_63::UnicodeString::moveFrom(&local_158,&local_78);
    icu_63::UnicodeString::~UnicodeString(&local_78);
    local_180 = (PtnSkeleton *)0x0;
    pUVar3 = getBestRaw(this,this->dtMatcher,missingFields,this->distanceInfo,status,&local_180);
    if (U_ZERO_ERROR < *status) {
      (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
           local_178._vptr_UObject;
      (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
      goto LAB_002ec243;
    }
    icu_63::UnicodeString::operator=(&local_f8,pUVar3);
    adjustFieldTypes(&local_78,this,&local_f8,local_180,flags,options);
    icu_63::UnicodeString::moveFrom(&local_158,&local_78);
    icu_63::UnicodeString::~UnicodeString(&local_78);
    if (this->distanceInfo->missingFieldMask != 0) {
      local_170 = flags | 1;
      local_160 = &this->field_0x108;
      uVar4 = 0;
      local_168 = status;
      do {
        missingFields_00 = this->distanceInfo;
        uVar5 = missingFields_00->missingFieldMask;
        if ((uVar5 == 0) || (uVar4 == uVar5)) goto LAB_002ec236;
        if (((missingFields & 0x6000U) == 0x6000) && ((uVar5 & 0x6000) == 0x4000)) {
          adjustFieldTypes(&local_78,this,&local_158,local_180,local_170,options);
          icu_63::UnicodeString::moveFrom(&local_158,&local_78);
          icu_63::UnicodeString::~UnicodeString(&local_78);
          missingFields_00 = this->distanceInfo;
          uVar5 = missingFields_00->missingFieldMask & 0xffffbfff;
          missingFields_00->missingFieldMask = uVar5;
          if ((uVar5 == 0) || (uVar4 == uVar5)) goto LAB_002ec236;
        }
        pUVar3 = getBestRaw(this,this->dtMatcher,uVar5,missingFields_00,status,&local_180);
        local_16c = *status;
        if (local_16c < U_ILLEGAL_ARGUMENT_ERROR) {
          icu_63::UnicodeString::operator=(&local_f8,pUVar3);
          adjustFieldTypes(&local_78,this,&local_f8,local_180,flags,options);
          icu_63::UnicodeString::moveFrom(&local_f8,&local_78);
          icu_63::UnicodeString::~UnicodeString(&local_78);
          status = local_168;
          uVar5 = uVar5 & ~this->distanceInfo->missingFieldMask;
          if (uVar5 == 0) {
            field = UDATPG_ERA_FIELD;
          }
          else {
            field = ~UDATPG_ERA_FIELD;
            do {
              field = field + UDATPG_YEAR_FIELD;
              bVar1 = 1 < uVar5;
              uVar5 = (int)uVar5 >> 1;
            } while (bVar1);
            if (UDATPG_FRACTIONAL_SECOND_FIELD < field) {
              field = UDATPG_ZONE_FIELD;
            }
          }
          lVar6 = (ulong)field * 0x40;
          if (*(short *)(local_160 + lVar6 + 8) < 0) {
            iVar2 = *(int *)(local_160 + lVar6 + 0xc);
          }
          else {
            iVar2 = (int)*(short *)(local_160 + lVar6 + 8) >> 5;
          }
          if (iVar2 != 0) {
            local_b8.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)(UObject)local_178._vptr_UObject;
            local_b8.fUnion.fStackFields.fLengthAndFlags = 2;
            getAppendName(this,field,&local_b8);
            local_118 = &local_158;
            local_110 = &local_f8;
            local_108 = &local_b8;
            SimpleFormatter::SimpleFormatter
                      ((SimpleFormatter *)&local_78,(UnicodeString *)(local_160 + lVar6),2,3,status)
            ;
            SimpleFormatter::formatAndReplace
                      ((SimpleFormatter *)&local_78,&local_118,3,&local_158,(int32_t *)0x0,0,status)
            ;
            SimpleFormatter::~SimpleFormatter((SimpleFormatter *)&local_78);
            icu_63::UnicodeString::~UnicodeString(&local_b8);
          }
          uVar4 = this->distanceInfo->missingFieldMask;
        }
        else {
          (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
               local_178._vptr_UObject;
          (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
        }
      } while (local_16c < U_ILLEGAL_ARGUMENT_ERROR);
      goto LAB_002ec243;
    }
  }
LAB_002ec236:
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__,&local_158);
LAB_002ec243:
  icu_63::UnicodeString::~UnicodeString(&local_f8);
  icu_63::UnicodeString::~UnicodeString(&local_158);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
DateTimePatternGenerator::getBestAppending(int32_t missingFields, int32_t flags, UErrorCode &status, UDateTimePatternMatchOptions options) {
    if (U_FAILURE(status)) {
        return UnicodeString();
    }
    UnicodeString  resultPattern, tempPattern;
    const UnicodeString* tempPatternPtr;
    int32_t lastMissingFieldMask=0;
    if (missingFields!=0) {
        resultPattern=UnicodeString();
        const PtnSkeleton* specifiedSkeleton=nullptr;
        tempPatternPtr = getBestRaw(*dtMatcher, missingFields, distanceInfo, status, &specifiedSkeleton);
        if (U_FAILURE(status)) {
            return UnicodeString();
        }
        tempPattern = *tempPatternPtr;
        resultPattern = adjustFieldTypes(tempPattern, specifiedSkeleton, flags, options);
        if ( distanceInfo->missingFieldMask==0 ) {
            return resultPattern;
        }
        while (distanceInfo->missingFieldMask!=0) { // precondition: EVERY single field must work!
            if ( lastMissingFieldMask == distanceInfo->missingFieldMask ) {
                break;  // cannot find the proper missing field
            }
            if (((distanceInfo->missingFieldMask & UDATPG_SECOND_AND_FRACTIONAL_MASK)==UDATPG_FRACTIONAL_MASK) &&
                ((missingFields & UDATPG_SECOND_AND_FRACTIONAL_MASK) == UDATPG_SECOND_AND_FRACTIONAL_MASK)) {
                resultPattern = adjustFieldTypes(resultPattern, specifiedSkeleton, flags | kDTPGFixFractionalSeconds, options);
                distanceInfo->missingFieldMask &= ~UDATPG_FRACTIONAL_MASK;
                continue;
            }
            int32_t startingMask = distanceInfo->missingFieldMask;
            tempPatternPtr = getBestRaw(*dtMatcher, distanceInfo->missingFieldMask, distanceInfo, status, &specifiedSkeleton);
            if (U_FAILURE(status)) {
                return UnicodeString();
            }
            tempPattern = *tempPatternPtr;
            tempPattern = adjustFieldTypes(tempPattern, specifiedSkeleton, flags, options);
            int32_t foundMask=startingMask& ~distanceInfo->missingFieldMask;
            int32_t topField=getTopBitNumber(foundMask);

            if (appendItemFormats[topField].length() != 0) {
                UnicodeString appendName;
                getAppendName((UDateTimePatternField)topField, appendName);
                const UnicodeString *values[3] = {
                    &resultPattern,
                    &tempPattern,
                    &appendName
                };
                SimpleFormatter(appendItemFormats[topField], 2, 3, status).
                    formatAndReplace(values, 3, resultPattern, nullptr, 0, status);
            }
            lastMissingFieldMask = distanceInfo->missingFieldMask;
        }
    }
    return resultPattern;
}